

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<double,double,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,double *v,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImGuiDataType data_type_00;
  ImGuiDataType data_type_01;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float logarithmic_zero_epsilon;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float local_a8;
  
  pIVar3 = GImGui;
  uVar7 = flags & 0x100000;
  fVar18 = *(float *)((long)&(bb->Min).x + (ulong)(uVar7 >> 0x12));
  fVar1 = *(float *)((long)&(bb->Max).x + (ulong)(uVar7 >> 0x12));
  fVar17 = (fVar1 - fVar18) + -4.0;
  uVar6 = data_type & 0xfffffffe;
  fVar19 = (GImGui->Style).GrabMinSize;
  dVar16 = (double)(~-(ulong)(v_min < v_max) & (ulong)(v_min - v_max) |
                   (ulong)(v_max - v_min) & -(ulong)(v_min < v_max));
  if ((uVar6 != 8) && (0.0 <= dVar16)) {
    fVar9 = (float)((double)fVar17 / (dVar16 + 1.0));
    uVar8 = -(uint)(fVar19 <= fVar9);
    fVar19 = (float)(~uVar8 & (uint)fVar19 | (uint)fVar9 & uVar8);
  }
  if (fVar17 <= fVar19) {
    fVar19 = fVar17;
  }
  fVar14 = fVar17 - fVar19;
  fVar9 = 0.0;
  logarithmic_zero_epsilon = 0.0;
  if ((flags & 0x20U) != 0) {
    if (uVar6 == 8) {
      iVar4 = ImParseFormatPrecision(format,3);
      fVar9 = (float)iVar4;
    }
    else {
      fVar9 = 1.0;
    }
    logarithmic_zero_epsilon = powf(0.1,fVar9);
    fVar9 = fVar14;
    if (fVar14 <= 1.0) {
      fVar9 = 1.0;
    }
    fVar9 = ((pIVar3->Style).LogSliderDeadzone * 0.5) / fVar9;
  }
  fVar18 = fVar18 + 2.0 + fVar19 * 0.5;
  if (pIVar3->ActiveId != id) {
    bVar5 = false;
    goto LAB_0015b142;
  }
  if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
    if (pIVar3->ActiveIdIsJustActivated == true) {
      pIVar3->SliderCurrentAccum = 0.0;
      pIVar3->SliderCurrentAccumDirty = false;
    }
    IVar2 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    fVar14 = IVar2.x;
    if (uVar7 != 0) {
      fVar14 = -IVar2.y;
    }
    if ((fVar14 != 0.0) || (NAN(fVar14))) {
      if ((uVar6 == 8) && (iVar4 = ImParseFormatPrecision(format,3), 0 < iVar4)) {
        fVar14 = fVar14 / 100.0;
        if (0.0 < (GImGui->IO).NavInputs[0xe]) {
          fVar14 = fVar14 / 10.0;
        }
      }
      else if ((ABS(dVar16) <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
        fVar14 = *(float *)(&DAT_001ab3a8 + (ulong)(fVar14 < 0.0) * 4) / (float)dVar16;
      }
      else {
        fVar14 = fVar14 / 100.0;
      }
      uVar6 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
      pIVar3->SliderCurrentAccum =
           (float)(~uVar6 & (uint)fVar14 | (uint)(fVar14 * 10.0) & uVar6) +
           pIVar3->SliderCurrentAccum;
      pIVar3->SliderCurrentAccumDirty = true;
    }
    fVar14 = pIVar3->SliderCurrentAccum;
    if ((pIVar3->NavActivatePressedId == id) && (pIVar3->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if (pIVar3->SliderCurrentAccumDirty == true) {
      bVar5 = SUB41((flags & 0x20U) >> 5,0);
      fVar11 = ScaleRatioFromValueT<double,double,double>
                         (data_type,*v,v_min,v_max,bVar5,logarithmic_zero_epsilon,fVar9);
      if (((1.0 <= fVar11) && (0.0 < fVar14)) || ((fVar11 <= 0.0 && (fVar14 < 0.0)))) {
        fVar15 = 0.0;
        bVar5 = false;
        fVar10 = fVar11;
      }
      else {
        fVar15 = fVar14 + fVar11;
        fVar10 = 1.0;
        if (fVar15 <= 1.0) {
          fVar10 = fVar15;
        }
        fVar10 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar10);
        dVar16 = ScaleValueFromRatioT<double,double,double>
                           (data_type,fVar10,v_min,v_max,bVar5,logarithmic_zero_epsilon,fVar9);
        uVar12 = SUB84(dVar16,0);
        uVar13 = (undefined4)((ulong)dVar16 >> 0x20);
        if ((flags & 0x40U) == 0) {
          dVar16 = RoundScalarWithFormatT<double,double>
                             ((ImGui *)format,(char *)(ulong)(uint)data_type,data_type_00,dVar16);
          uVar12 = SUB84(dVar16,0);
          uVar13 = (undefined4)((ulong)dVar16 >> 0x20);
        }
        fVar15 = ScaleRatioFromValueT<double,double,double>
                           (data_type,(double)CONCAT44(uVar13,uVar12),v_min,v_max,bVar5,
                            logarithmic_zero_epsilon,fVar9);
        fVar15 = fVar15 - fVar11;
        if (fVar14 <= 0.0) {
          fVar15 = (float)(~-(uint)(fVar14 <= fVar15) & (uint)fVar14 |
                          (uint)fVar15 & -(uint)(fVar14 <= fVar15));
        }
        else if (fVar14 <= fVar15) {
          fVar15 = fVar14;
        }
        fVar15 = pIVar3->SliderCurrentAccum - fVar15;
        bVar5 = true;
      }
      pIVar3->SliderCurrentAccum = fVar15;
      pIVar3->SliderCurrentAccumDirty = false;
      goto LAB_0015b0be;
    }
    fVar10 = 0.0;
    bVar5 = false;
  }
  else {
    fVar10 = 0.0;
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar3->IO).MouseDown[0] != false) {
        if (0.0 < fVar14) {
          fVar14 = (*(float *)((pIVar3->IO).MouseDown + (ulong)(uVar7 >> 0x14) * 4 + -8) - fVar18) /
                   fVar14;
          fVar10 = 1.0;
          if (fVar14 <= 1.0) {
            fVar10 = fVar14;
          }
          fVar10 = (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar10);
        }
        if (uVar7 != 0) {
          fVar10 = 1.0 - fVar10;
        }
        bVar5 = true;
        goto LAB_0015b0be;
      }
      ClearActiveID();
    }
    fVar10 = 0.0;
    bVar5 = false;
  }
LAB_0015b0be:
  if (bVar5) {
    dVar16 = ScaleValueFromRatioT<double,double,double>
                       (data_type,fVar10,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                        logarithmic_zero_epsilon,fVar9);
    uVar12 = SUB84(dVar16,0);
    uVar13 = (undefined4)((ulong)dVar16 >> 0x20);
    if ((flags & 0x40U) == 0) {
      dVar16 = RoundScalarWithFormatT<double,double>
                         ((ImGui *)format,(char *)(ulong)(uint)data_type,data_type_01,dVar16);
      uVar12 = SUB84(dVar16,0);
      uVar13 = (undefined4)((ulong)dVar16 >> 0x20);
    }
    dVar16 = *v;
    if ((dVar16 != (double)CONCAT44(uVar13,uVar12)) ||
       (NAN(dVar16) || NAN((double)CONCAT44(uVar13,uVar12)))) {
      *v = (double)CONCAT44(uVar13,uVar12);
      bVar5 = true;
    }
    else {
      bVar5 = (bool)(-((double)CONCAT44(uVar13,uVar12) != dVar16) & 1);
    }
  }
  else {
    bVar5 = false;
  }
LAB_0015b142:
  if (1.0 <= fVar17) {
    local_a8 = -fVar19;
    fVar17 = ScaleRatioFromValueT<double,double,double>
                       (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                        logarithmic_zero_epsilon,fVar9);
    if (uVar7 != 0) {
      fVar17 = 1.0 - fVar17;
    }
    fVar18 = (((fVar1 + -2.0) - fVar19 * 0.5) - fVar18) * fVar17 + fVar18;
    if (uVar7 != 0) {
      fVar1 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = local_a8 * 0.5 + fVar18;
      (out_grab_bb->Max).x = fVar1 + -2.0;
      (out_grab_bb->Max).y = fVar19 * 0.5 + fVar18;
    }
    else {
      fVar1 = (bb->Min).y;
      fVar17 = (bb->Max).y;
      (out_grab_bb->Min).x = local_a8 * 0.5 + fVar18;
      (out_grab_bb->Min).y = fVar1 + 2.0;
      (out_grab_bb->Max).x = fVar19 * 0.5 + fVar18;
      (out_grab_bb->Max).y = fVar17 + -2.0;
    }
  }
  else {
    IVar2 = bb->Min;
    out_grab_bb->Min = IVar2;
    out_grab_bb->Max = IVar2;
  }
  return bVar5;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}